

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::egl::anon_unknown_0::GetSyncInvalidAttributeTest::iterate(GetSyncInvalidAttributeTest *this)

{
  ostringstream *poVar1;
  EGLSyncKHR *value;
  EGLDisplay *value_00;
  ostringstream *poVar2;
  EGLenum EVar3;
  TestLog *pTVar4;
  int iVar5;
  deUint32 err;
  int iVar6;
  Library *pLVar7;
  undefined4 extraout_var;
  MessageBuilder *pMVar8;
  TestError *this_00;
  char *pcVar9;
  qpTestResult testResult;
  char *pcVar10;
  TestContext *this_01;
  EGLint condition;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  
  pLVar7 = EglTestContext::getLibrary((this->super_SyncTest).super_TestCase.m_eglTestCtx);
  pTVar4 = ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar5 = (*pLVar7->_vptr_Library[0x11])
                    (pLVar7,(this->super_SyncTest).m_eglDisplay,
                     (ulong)(this->super_SyncTest).m_syncType,0);
  value = &(this->super_SyncTest).m_sync;
  (this->super_SyncTest).m_sync = (EGLSyncKHR)CONCAT44(extraout_var,iVar5);
  local_1b0._0_8_ = pTVar4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
  pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
  std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                  " = eglCreateSyncKHR(");
  value_00 = &(this->super_SyncTest).m_eglDisplay;
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,value_00);
  poVar1 = &pMVar8->m_str;
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", ");
  EVar3 = (this->super_SyncTest).m_syncType;
  pcVar9 = "<Unknown>";
  if (EVar3 == 0x30fa) {
    pcVar9 = "EGL_SYNC_REUSABLE_KHR";
  }
  pcVar10 = "EGL_SYNC_FENCE_KHR";
  if (EVar3 != 0x30f9) {
    pcVar10 = pcVar9;
  }
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,pcVar10);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", NULL)");
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  err = (*pLVar7->_vptr_Library[0x1f])(pLVar7);
  eglu::checkError(err,"eglCreateSyncKHR()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x386);
  iVar5 = (*pLVar7->_vptr_Library[0x24])(pLVar7,*value_00,*value,0x3038);
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar4;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<((ostream *)poVar2," = eglGetSyncAttribKHR(");
  pMVar8 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value_00);
  std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,value);
  poVar1 = &pMVar8->m_str;
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,", EGL_NONE, {");
  std::ostream::operator<<(poVar1,0xf0f0f);
  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"})");
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  iVar6 = (*pLVar7->_vptr_Library[0x1f])(pLVar7);
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar4;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::ostream::operator<<(poVar2,iVar6);
  std::operator<<((ostream *)poVar2," = eglGetError()");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  if (iVar6 == 0x3004) {
    if (iVar5 != 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,(char *)0x0,"result == EGL_FALSE",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                 ,0x396);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    this_01 = (this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    pcVar9 = "Pass";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    poVar2 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar4;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Unexpected error \'");
    local_1c0.m_getName = eglu::getErrorName;
    local_1c0.m_value = iVar6;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar2);
    std::operator<<((ostream *)poVar2,"\' expected EGL_BAD_ATTRIBUTE");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    this_01 = (this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    pcVar9 = "Fail";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult(this_01,testResult,pcVar9);
  return STOP;
}

Assistant:

IterateResult	iterate						(void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		TestLog&		log		= m_testCtx.getLog();

		m_sync = egl.createSyncKHR(m_eglDisplay, m_syncType, NULL);
		log << TestLog::Message << m_sync << " = eglCreateSyncKHR(" << m_eglDisplay << ", " << getSyncTypeName(m_syncType) << ", NULL)" << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "eglCreateSyncKHR()");

		EGLint condition = 0xF0F0F;
		EGLBoolean result = egl.getSyncAttribKHR(m_eglDisplay, m_sync, EGL_NONE, &condition);
		log << TestLog::Message << result << " = eglGetSyncAttribKHR(" << m_eglDisplay << ", " << m_sync << ", EGL_NONE, {" << condition << "})" << TestLog::EndMessage;

		EGLint error = egl.getError();
		log << TestLog::Message << error << " = eglGetError()" << TestLog::EndMessage;

		if (error != EGL_BAD_ATTRIBUTE)
		{
			log << TestLog::Message << "Unexpected error '" << eglu::getErrorStr(error) << "' expected EGL_BAD_ATTRIBUTE" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		TCU_CHECK(result == EGL_FALSE);
		TCU_CHECK(condition == 0xF0F0F);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}